

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimedExecution.h
# Opt level: O2

void nrg::TimedExecution::push<TimedCaller>(Queue *queue,TimedCaller *fn)

{
  QueueElement elem;
  QueueElement QStack_68;
  QueueElement local_40;
  
  local_40.when.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
  std::function<void()>::function<TimedCaller,void>((function<void()> *)&local_40.what,fn);
  QueueElement::QueueElement(&QStack_68,&local_40);
  std::
  priority_queue<nrg::TimedExecution::QueueElement,_std::vector<nrg::TimedExecution::QueueElement,_std::allocator<nrg::TimedExecution::QueueElement>_>,_std::greater<nrg::TimedExecution::QueueElement>_>
  ::push(queue,&QStack_68);
  std::_Function_base::~_Function_base(&QStack_68.what.super__Function_base);
  std::_Function_base::~_Function_base(&local_40.what.super__Function_base);
  return;
}

Assistant:

static void push(Queue& queue, FN fn)
    {
        QueueElement elem = { now(), std::move(fn) };
        push(queue, std::move(elem));
    }